

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O3

RGB pbrt::PixelSensor::ProjectReflectance<pbrt::RGB>
              (SpectrumHandle *refl,SpectrumHandle *illum,SpectrumHandle *b1,SpectrumHandle *b2,
              SpectrumHandle *b3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar7 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  RGB RVar11;
  float local_100;
  float local_fc;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_f8;
  DispatchSplit<7> local_e9;
  Float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  SpectrumHandle *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  SpectrumHandle *local_a8;
  SpectrumHandle *local_a0;
  SpectrumHandle *local_98;
  SpectrumHandle *local_90;
  Float local_88;
  Float local_78;
  Float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  iVar4 = 0x168;
  local_48 = ZEXT816(0) << 0x40;
  local_b8 = ZEXT816(0);
  local_c8 = ZEXT416(0) << 0x40;
  local_d0 = b2;
  local_a8 = illum;
  local_a0 = refl;
  local_98 = b1;
  local_90 = b3;
  do {
    local_100 = (float)iVar4;
    local_f8.bits =
         (local_d0->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_fc = local_100;
    local_e8 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (illum->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    auVar7._0_4_ = DispatchSplit<7>::operator()
                             (&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    auVar7._4_60_ = extraout_var;
    local_c8 = vfmadd231ss_fma(local_c8,auVar7._0_16_,ZEXT416((uint)local_e8));
    local_100 = local_fc;
    local_f8.bits =
         (local_98->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_e8 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (refl->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    uStack_e4 = extraout_XMM0_Db;
    uStack_e0 = extraout_XMM0_Dc;
    uStack_dc = extraout_XMM0_Dd;
    local_58 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (illum->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    uStack_54 = extraout_XMM0_Db_00;
    uStack_50 = extraout_XMM0_Dc_00;
    uStack_4c = extraout_XMM0_Dd_00;
    local_68 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (local_d0->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    uStack_64 = extraout_XMM0_Db_01;
    uStack_60 = extraout_XMM0_Dc_01;
    uStack_5c = extraout_XMM0_Dd_01;
    local_78 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (refl->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_88 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (illum->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    auVar8._0_4_ = DispatchSplit<7>::operator()
                             (&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    auVar8._4_60_ = extraout_var_00;
    auVar1._4_4_ = uStack_e4;
    auVar1._0_4_ = local_e8;
    auVar1._8_4_ = uStack_e0;
    auVar1._12_4_ = uStack_dc;
    auVar2._4_4_ = uStack_54;
    auVar2._0_4_ = local_58;
    auVar2._8_4_ = uStack_50;
    auVar2._12_4_ = uStack_4c;
    auVar3._4_4_ = uStack_64;
    auVar3._0_4_ = local_68;
    auVar3._8_4_ = uStack_60;
    auVar3._12_4_ = uStack_5c;
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_78),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_88),0x10);
    auVar3 = vinsertps_avx(auVar3,auVar8._0_16_,0x10);
    auVar10._0_4_ = auVar1._0_4_ * auVar2._0_4_;
    auVar10._4_4_ = auVar1._4_4_ * auVar2._4_4_;
    auVar10._8_4_ = auVar1._8_4_ * auVar2._8_4_;
    auVar10._12_4_ = auVar1._12_4_ * auVar2._12_4_;
    local_b8 = vfmadd231ps_fma(local_b8,auVar10,auVar3);
    local_100 = local_fc;
    local_f8.bits =
         (local_90->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    local_e8 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_100 = local_fc;
    local_f8.bits =
         (refl->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    FVar5 = DispatchSplit<7>::operator()(&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    local_e8 = FVar5 * local_e8;
    local_100 = local_fc;
    local_f8.bits =
         (illum->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
         ).bits;
    auVar9._0_4_ = DispatchSplit<7>::operator()
                             (&local_e9,&local_100,&local_f8,local_f8.bits >> 0x30);
    auVar9._4_60_ = extraout_var_01;
    iVar4 = iVar4 + 1;
    local_48 = vfmadd231ss_fma(local_48,auVar9._0_16_,ZEXT416((uint)local_e8));
  } while (iVar4 != 0x33f);
  auVar6._4_4_ = local_c8._0_4_;
  auVar6._0_4_ = local_c8._0_4_;
  auVar6._8_4_ = local_c8._0_4_;
  auVar6._12_4_ = local_c8._0_4_;
  auVar1 = vdivps_avx(local_b8,auVar6);
  RVar11.b = local_48._0_4_ / (float)local_c8._0_4_;
  RVar11._0_8_ = auVar1._0_8_;
  return RVar11;
}

Assistant:

inline Triplet PixelSensor::ProjectReflectance(SpectrumHandle refl, SpectrumHandle illum,
                                               SpectrumHandle b1, SpectrumHandle b2,
                                               SpectrumHandle b3) {
    Triplet result;
    Float g_integral = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda) {
        g_integral += b2(lambda) * illum(lambda);
        result[0] += b1(lambda) * refl(lambda) * illum(lambda);
        result[1] += b2(lambda) * refl(lambda) * illum(lambda);
        result[2] += b3(lambda) * refl(lambda) * illum(lambda);
    }
    return result / g_integral;
}